

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 IVar1;
  bool bVar2;
  uint uVar3;
  char *label_00;
  char *pcVar4;
  char *windows;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *columns;
  char *pcVar8;
  char *lhs;
  ImVec2 IVar9;
  int n;
  ImRect r;
  int layer;
  ImGuiWindowFlags flags;
  bool open;
  ImGuiTreeNodeFlags tree_node_flags;
  bool is_active;
  ImGuiContext *g;
  char *in_stack_00000240;
  ImDrawList *in_stack_00000248;
  ImGuiWindow *in_stack_00000250;
  ImVec2 *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  int count;
  ImGuiHoveredFlags in_stack_ffffffffffffff40;
  ImVec4 *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  ImGuiCol in_stack_ffffffffffffff54;
  char *local_a8;
  uint local_90;
  int local_70;
  float local_5c;
  float fStack_58;
  float local_54;
  float thickness;
  ImDrawFlags in_stack_ffffffffffffffb4;
  uint flags_00;
  float in_stack_ffffffffffffffb8;
  float rounding;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar10;
  undefined3 in_stack_ffffffffffffffcc;
  uint uVar11;
  ImGuiContext *this;
  
  count = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  if (in_RDI == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",in_RSI);
  }
  else {
    uVar11 = CONCAT13(in_RDI->WasActive,in_stack_ffffffffffffffcc) & 0x1ffffff;
    uVar3 = (uint)(in_RDI == GImGui->NavWindow);
    this = GImGui;
    if ((char)(uVar11 >> 0x18) == '\0') {
      GetStyleColorVec4(1);
      PushStyleColor(in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
    }
    pcVar6 = " *Inactive*";
    if ((uVar11 & 0x1000000) != 0) {
      pcVar6 = "";
    }
    bVar2 = TreeNodeEx((char *)in_RSI,(ImGuiTreeNodeFlags)(ulong)uVar3,"%s \'%s\'%s",in_RSI,
                       in_RDI->Name,pcVar6);
    uVar10 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffc4);
    if ((uVar11 & 0x1000000) == 0) {
      PopStyleColor(count);
    }
    bVar2 = IsItemHovered(in_stack_ffffffffffffff40);
    if ((bVar2) && ((uVar11 & 0x1000000) != 0)) {
      GetForegroundDrawList((ImGuiWindow *)0x13c67d);
      IVar9 = operator+(in_stack_ffffffffffffff28,(ImVec2 *)0x13c69f);
      in_stack_ffffffffffffffbc = IVar9.x;
      in_stack_ffffffffffffffc0 = IVar9.y;
      thickness = (float)((ulong)_local_54 >> 0x20);
      ImDrawList::AddRect((ImDrawList *)this,(ImVec2 *)CONCAT44(uVar11,uVar3),
                          (ImVec2 *)CONCAT44(uVar10,in_stack_ffffffffffffffc0),
                          (ImU32)in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb4,thickness);
    }
    if ((uVar10 & 0x1000000) != 0) {
      if ((in_RDI->MemoryCompacted & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      rounding = (float)in_RDI->Flags;
      DebugNodeDrawList(in_stack_00000250,in_stack_00000248,in_stack_00000240);
      BulletText((char *)(double)(in_RDI->Pos).x,(double)(in_RDI->Pos).y,(double)(in_RDI->Size).x,
                 (double)(in_RDI->Size).y,(double)(in_RDI->ContentSize).x,
                 (double)(in_RDI->ContentSize).y,(double)(in_RDI->ContentSizeIdeal).x,
                 (double)(in_RDI->ContentSizeIdeal).y,
                 "Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)");
      pcVar6 = "";
      if (((uint)rounding & 0x1000000) != 0) {
        pcVar6 = "Child ";
      }
      pcVar4 = "";
      if (((uint)rounding & 0x2000000) != 0) {
        pcVar4 = "Tooltip ";
      }
      pcVar5 = "";
      if (((uint)rounding & 0x4000000) != 0) {
        pcVar5 = "Popup ";
      }
      pcVar7 = "";
      if (((uint)rounding & 0x8000000) != 0) {
        pcVar7 = "Modal ";
      }
      lhs = "";
      if (((uint)rounding & 0x10000000) != 0) {
        lhs = "ChildMenu ";
      }
      windows = "";
      if (((uint)rounding & 0x100) != 0) {
        windows = "NoSavedSettings ";
      }
      pcVar8 = "";
      if (((uint)rounding & 0x200) != 0) {
        pcVar8 = "NoMouseInputs";
      }
      columns = "";
      if (((uint)rounding & 0x40000) != 0) {
        columns = "NoNavInputs";
      }
      label_00 = "";
      if (((uint)rounding & 0x40) != 0) {
        label_00 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)(uint)rounding,pcVar6,pcVar4,pcVar5,
                 pcVar7,lhs,windows,pcVar8);
      pcVar6 = "";
      if ((in_RDI->ScrollbarX & 1U) != 0) {
        pcVar6 = "X";
      }
      pcVar4 = "";
      if ((in_RDI->ScrollbarY & 1U) != 0) {
        pcVar4 = "Y";
      }
      BulletText((char *)(double)(in_RDI->Scroll).x,(double)(in_RDI->ScrollMax).x,
                 (double)(in_RDI->Scroll).y,(double)(in_RDI->ScrollMax).y,
                 "Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",pcVar6,pcVar4);
      if (((in_RDI->Active & 1U) == 0) && ((in_RDI->WasActive & 1U) == 0)) {
        local_90 = 0xffffffff;
      }
      else {
        local_90 = (uint)in_RDI->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(in_RDI->Active & 1),(ulong)(in_RDI->WasActive & 1),
                 (ulong)(in_RDI->WriteAccessed & 1),(ulong)local_90);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(in_RDI->Appearing & 1),(ulong)(in_RDI->Hidden & 1),
                 (ulong)(uint)(int)in_RDI->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)in_RDI->HiddenFramesCannotSkipItems,
                 (ulong)(in_RDI->SkipItems & 1),lhs,windows,pcVar8);
      for (flags_00 = 0; (int)flags_00 < 2; flags_00 = flags_00 + 1) {
        IVar9 = in_RDI->NavRectRel[(int)flags_00].Min;
        IVar1 = in_RDI->NavRectRel[(int)flags_00].Max;
        local_5c = IVar9.x;
        thickness = IVar1.y;
        fStack_58 = IVar9.y;
        if ((local_5c < thickness) || (fStack_58 < thickness)) {
          local_54 = IVar1.x;
          BulletText((char *)(double)local_5c,(double)fStack_58,(double)local_54,(double)thickness,
                     "NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(ulong)flags_00,
                     (ulong)in_RDI->NavLastIds[(int)flags_00]);
          bVar2 = IsItemHovered((ImGuiHoveredFlags)columns);
          if (bVar2) {
            GetForegroundDrawList((ImGuiWindow *)0x13cbe1);
            operator+((ImVec2 *)lhs,(ImVec2 *)0x13cbfc);
            operator+((ImVec2 *)lhs,(ImVec2 *)0x13cc1b);
            ImDrawList::AddRect((ImDrawList *)this,(ImVec2 *)CONCAT44(uVar11,uVar3),
                                (ImVec2 *)CONCAT44(uVar10,in_stack_ffffffffffffffc0),
                                (ImU32)in_stack_ffffffffffffffbc,rounding,flags_00,thickness);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)flags_00,
                     (ulong)in_RDI->NavLastIds[(int)flags_00]);
        }
      }
      if (in_RDI->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        local_a8 = "NULL";
      }
      else {
        local_a8 = in_RDI->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(in_RDI->DC).NavLayersActiveMask,local_a8);
      if (in_RDI->RootWindow != in_RDI) {
        DebugNodeWindow(in_RSI,&this->Initialized);
      }
      if (in_RDI->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(in_RSI,&this->Initialized);
      }
      if (0 < (in_RDI->DC).ChildWindows.Size) {
        DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)windows,lhs);
      }
      if ((0 < (in_RDI->ColumnsStorage).Size) &&
         (bVar2 = TreeNode("Columns","Columns sets (%d)",(ulong)(uint)(in_RDI->ColumnsStorage).Size)
         , bVar2)) {
        for (local_70 = 0; local_70 < (in_RDI->ColumnsStorage).Size; local_70 = local_70 + 1) {
          ImVector<ImGuiOldColumns>::operator[](&in_RDI->ColumnsStorage,local_70);
          DebugNodeColumns((ImGuiOldColumns *)columns);
        }
        TreePop();
      }
      DebugNodeStorage((ImGuiStorage *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                       ,label_00);
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}